

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iostream-test.c++
# Opt level: O3

void __thiscall kj::std::anon_unknown_0::TestCase49::run(TestCase49 *this)

{
  long lVar1;
  StdInputStream in;
  StdOutputStream out;
  byte buf [9];
  DebugComparison<kj::ArrayPtr<const_unsigned_char>,_kj::ArrayPtr<unsigned_char>_> local_1f0;
  ArrayPtr<unsigned_char> local_1b8;
  ArrayPtr<const_unsigned_char> local_1a8;
  stringstream ss;
  ostream local_188 [112];
  ios_base local_118 [264];
  
  ::std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  in.super_InputStream._vptr_InputStream = (_func_int **)&PTR__BufferedInputStream_00226f50;
  out.stream_ = local_188;
  out.super_OutputStream._vptr_OutputStream = (_func_int **)&PTR__ArrayOutputStream_00226f98;
  in.stream_ = (istream *)&ss;
  ::std::ostream::write((char *)out.stream_,0x1df0b8);
  buf[8] = '\0';
  buf[0] = '\0';
  buf[1] = '\0';
  buf[2] = '\0';
  buf[3] = '\0';
  buf[4] = '\0';
  buf[5] = '\0';
  buf[6] = '\0';
  buf[7] = '\0';
  ::std::istream::read((char *)&ss,(long)buf);
  local_1f0.right.size_ = *(size_t *)(in.stream_ + 8);
  if (local_1f0.right.size_ == 6) {
    lVar1 = 0;
    do {
      if ((&_::ByteLiteral<7ul>)[lVar1] != buf[lVar1]) goto LAB_001a51ad;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 6);
    local_1f0.result = true;
  }
  else {
LAB_001a51ad:
    local_1f0.result = false;
  }
  local_1f0.left.ptr =
       "foobar/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
  ;
  local_1f0.left.size_ = 6;
  local_1f0.op.content.ptr = " == ";
  local_1f0.op.content.size_ = 5;
  local_1f0.right.ptr = buf;
  if ((local_1f0.result == false) && (_::Debug::minSeverity < 3)) {
    local_1a8.ptr =
         "foobar/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
    ;
    local_1a8.size_ = 6;
    local_1b8.ptr = buf;
    local_1b8.size_ = local_1f0.right.size_;
    _::Debug::
    log<char_const(&)[65],kj::_::DebugComparison<kj::ArrayPtr<unsigned_char_const>,kj::ArrayPtr<unsigned_char>>&,kj::ArrayPtr<unsigned_char_const>,kj::ArrayPtr<unsigned_char>>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/std/iostream-test.c++"
               ,0x3d,ERROR,
               "\"failed: expected \" \"(\\\"foobar\\\"_kjb) == (arrayPtr(buf).first(amount))\", _kjCondition, \"foobar\"_kjb, arrayPtr(buf).first(amount)"
               ,(char (*) [65])"failed: expected (\"foobar\"_kjb) == (arrayPtr(buf).first(amount))",
               &local_1f0,&local_1a8,&local_1b8);
  }
  ArrayOutputStream::~ArrayOutputStream((ArrayOutputStream *)&out);
  BufferedInputStream::~BufferedInputStream((BufferedInputStream *)&in);
  ::std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  ::std::ios_base::~ios_base(local_118);
  return;
}

Assistant:

TEST(StdIoStream, TryReadToEndOfFile) {
  // Check that tryRead works when eof is reached before minBytes.

  ::std::stringstream ss;

  StdInputStream in(ss);
  StdOutputStream out(ss);

  out.write("foobar"_kjb);

  byte buf[9]{};
  auto amount = in.tryRead(buf, 8);
  EXPECT_EQ("foobar"_kjb, arrayPtr(buf).first(amount));
}